

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

void free_dir_tree(dir_tree_t *tree)

{
  file_entry_s *pfVar1;
  file_entry_t *next;
  file_entry_t *entry;
  dir_tree_t *tree_local;
  
  if (tree != (dir_tree_t *)0x0) {
    next = tree->files;
    while (next != (file_entry_t *)0x0) {
      pfVar1 = next->next;
      free(next);
      next = pfVar1;
    }
    free(tree);
  }
  return;
}

Assistant:

void free_dir_tree(dir_tree_t *tree)
{
	file_entry_t *entry, *next;

	if (tree != NULL)
	{
		for (entry = tree->files; entry != NULL; entry = next)
		{
			next = entry->next;
			free(entry);
		}
		free(tree);
	}
}